

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.h
# Opt level: O0

Nonnull<char_*>
absl::lts_20250127::numbers_internal::FastIntToBuffer<wchar_t>(wchar_t i,Nonnull<char_*> buffer)

{
  Nonnull<char_*> pcVar1;
  bool kUse64Bit;
  bool kIsSigned;
  Nonnull<char_*> buffer_local;
  wchar_t i_local;
  
  pcVar1 = FastIntToBuffer(i,buffer);
  return pcVar1;
}

Assistant:

ABSL_INTERNAL_NEED_MIN_SIZE(buffer, kFastToBufferSize) {
  static_assert(sizeof(i) <= 64 / 8,
                "FastIntToBuffer works only with 64-bit-or-less integers.");
  // TODO(jorg): This signed-ness check is used because it works correctly
  // with enums, and it also serves to check that int_type is not a pointer.
  // If one day something like std::is_signed<enum E> works, switch to it.
  // These conditions are constexpr bools to suppress MSVC warning C4127.
  constexpr bool kIsSigned = static_cast<int_type>(1) - 2 < 0;
  constexpr bool kUse64Bit = sizeof(i) > 32 / 8;
  if (kIsSigned) {
    if (kUse64Bit) {
      return FastIntToBuffer(static_cast<int64_t>(i), buffer);
    } else {
      return FastIntToBuffer(static_cast<int32_t>(i), buffer);
    }
  } else {
    if (kUse64Bit) {
      return FastIntToBuffer(static_cast<uint64_t>(i), buffer);
    } else {
      return FastIntToBuffer(static_cast<uint32_t>(i), buffer);
    }
  }
}